

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_cargo_static_list_alloced_items(void)

{
  int iVar1;
  uint uVar2;
  char *local_88;
  char *args [4];
  long local_60;
  size_t input_count;
  char *inputs [5];
  cargo_t local_28;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init(&local_28,0,"program");
  if (iVar1 == 0) {
    local_60 = 0;
    local_88 = "catcierge";
    args[0] = "--input";
    args[1] = "abc";
    args[2] = "def";
    uVar2 = cargo_add_option(local_28,0,"--template --input",(char *)0x0,".[s]+",&input_count,
                             &local_60,5);
    cargo._4_4_ = uVar2 | cargo._4_4_;
    if (cargo._4_4_ == 0) {
      cargo._4_4_ = cargo_parse(local_28,0,1,4,&local_88);
      if (cargo._4_4_ == 0) {
        if ((input_count == 0) || (iVar1 = strcmp((char *)input_count,"abc"), iVar1 != 0)) {
          pcStack_18 = "Expected inputs[0] == \'abc\'";
        }
        else if ((inputs[0] == (char *)0x0) || (iVar1 = strcmp(inputs[0],"def"), iVar1 != 0)) {
          pcStack_18 = "Expected inputs[0] == \'def\'";
        }
        else if (local_60 != 2) {
          pcStack_18 = "Expected two inputs";
        }
      }
      else {
        pcStack_18 = "Parse failed";
      }
    }
    else {
      pcStack_18 = "Failed to add option";
    }
    free((void *)input_count);
    free(inputs[0]);
    cargo_destroy(&local_28);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_cargo_static_list_alloced_items)
{
    #define MAX_INPUT_TEMPLATES 5
    char *inputs[MAX_INPUT_TEMPLATES];
    size_t input_count = 0;
    char *args[] = { "catcierge", "--input", "abc", "def" };

    ret |= cargo_add_option(cargo, 0,
            "--template --input", NULL,
            ".[s]+", &inputs, &input_count, MAX_INPUT_TEMPLATES);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed");
    cargo_assert(inputs[0] && !strcmp(inputs[0], "abc"),
        "Expected inputs[0] == 'abc'");
    cargo_assert(inputs[1] && !strcmp(inputs[1], "def"),
        "Expected inputs[0] == 'def'");
    cargo_assert(input_count == 2, "Expected two inputs");

    _TEST_CLEANUP();
    free(inputs[0]);
    free(inputs[1]);
}